

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

void free_exporter_master_secret(ptls_t *tls,int is_early)

{
  int in_ESI;
  long in_RDI;
  uint8_t *slot;
  void *local_20;
  
  if (in_ESI == 0) {
    local_20 = *(void **)(in_RDI + 0x158);
  }
  else {
    local_20 = *(void **)(in_RDI + 0x150);
  }
  if (local_20 != (void *)0x0) {
    if (*(long *)(in_RDI + 0x50) == 0) {
      __assert_fail("tls->key_schedule != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                    ,0x424,"void free_exporter_master_secret(ptls_t *, int)");
    }
    (*ptls_clear_memory)(local_20,*(size_t *)(*(long *)(*(long *)(in_RDI + 0x50) + 0x58) + 8));
    free(local_20);
  }
  return;
}

Assistant:

static void free_exporter_master_secret(ptls_t *tls, int is_early)
{
    uint8_t *slot = is_early ? tls->exporter_master_secret.early : tls->exporter_master_secret.one_rtt;
    if (slot == NULL)
        return;
    assert(tls->key_schedule != NULL);
    ptls_clear_memory(slot, tls->key_schedule->hashes[0].algo->digest_size);
    free(slot);
}